

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

void fct_standard_logger__on_test_skip(fct_logger_i *logger_,fct_logger_evt_t *e)

{
  char *pcVar1;
  char local_128 [8];
  char msg [256];
  char *name;
  char *condition;
  fct_logger_evt_t *e_local;
  fct_logger_i *logger__local;
  
  pcVar1 = e->cndtn;
  msg._248_8_ = e->name;
  memset(local_128,0,0x100);
  fct_snprintf(local_128,0x100,"%s (%s)",msg._248_8_,pcVar1);
  msg[0xf7] = '\0';
  fct_dotted_line_start(0x44,local_128);
  fct_dotted_line_end("- SKIP -");
  return;
}

Assistant:

static void
fct_standard_logger__on_test_skip(
    fct_logger_i* logger_,
    fct_logger_evt_t const *e
)
{
    char const *condition = e->cndtn;
    char const *name = e->name;
    char msg[256] = {'\0'};
    fct_unused(logger_);
    fct_unused(condition);
    fct_snprintf(msg, sizeof(msg), "%s (%s)", name, condition);
    msg[sizeof(msg)-1] = '\0';
    fct_dotted_line_start(FCT_STANDARD_LOGGER_MAX_LINE, msg);
    fct_dotted_line_end("- SKIP -");
}